

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt_save_bmp(djg_texture *texture,char *filename)

{
  djg_texture *pdVar1;
  int iVar2;
  uint local_43c;
  char local_438 [4];
  int i;
  char buf [1024];
  int cnt;
  djg_texture *it;
  char *filename_local;
  djg_texture *texture_local;
  
  pdVar1 = texture->next;
  iVar2 = djgt__count(texture);
  if (iVar2 == 1) {
    sprintf(local_438,"%s.bmp",filename);
    iVar2 = stbi_write_bmp(local_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels);
    texture_local._7_1_ = iVar2 != 0;
  }
  else {
    local_43c = 1;
    do {
      if (pdVar1 == (djg_texture *)0x0) {
        return true;
      }
      sprintf(local_438,"%s_layer%03i.bmp",filename,(ulong)local_43c);
      local_43c = local_43c + 1;
      iVar2 = stbi_write_bmp(local_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels);
    } while (iVar2 != 0);
    texture_local._7_1_ = false;
  }
  return texture_local._7_1_;
}

Assistant:

bool djgt_save_bmp(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.bmp", filename);

        return stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.bmp", filename, i);

            ++i;
            if (!stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels))
                return false;
        }
    }

    return true;
}